

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQNativeClosure::~SQNativeClosure(SQNativeClosure *this)

{
  _func_int **pp_Var1;
  SQCollectable_conflict *in_RDI;
  
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQNativeClosure_00157228;
  if (in_RDI[2].super_SQRefCounted._vptr_SQRefCounted != (_func_int **)0x0) {
    pp_Var1 = in_RDI[2].super_SQRefCounted._vptr_SQRefCounted;
    pp_Var1[1] = pp_Var1[1] + -1;
    if (in_RDI[2].super_SQRefCounted._vptr_SQRefCounted[1] == (_func_int *)0x0) {
      (**(code **)(*in_RDI[2].super_SQRefCounted._vptr_SQRefCounted + 0x10))();
    }
    in_RDI[2].super_SQRefCounted._vptr_SQRefCounted = (_func_int **)0x0;
  }
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  sqvector<long_long>::~sqvector((sqvector<long_long> *)in_RDI);
  SQCollectable::~SQCollectable((SQCollectable *)0x127f63);
  return;
}

Assistant:

~SQNativeClosure()
    {
        __ObjRelease(_env);
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
    }